

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdft.c
# Opt level: O2

char * gdImageStringFTEx(gdImage *im,int *brect,int fg,char *fontlist,double ptsize,double angle,
                        int x,int y,char *string,gdFTStringExtraPtr strex)

{
  return "libgd was not built with FreeType font support\n";
}

Assistant:

BGD_DECLARE(char *) gdImageStringFTEx (gdImage * im, int *brect, int fg, char *fontlist,
                                       double ptsize, double angle, int x, int y, char *string,
                                       gdFTStringExtraPtr strex)
{
	(void)im;
	(void)brect;
	(void)fg;
	(void)fontlist;
	(void)ptsize;
	(void)angle;
	(void)x;
	(void)y;
	(void)string;
	(void)strex;

	return "libgd was not built with FreeType font support\n";
}